

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O1

ssize_t __thiscall
wabt::intrusive_list<wabt::Expr>::splice
          (intrusive_list<wabt::Expr> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  char *pcVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  __off64_t *p_Var5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  intrusive_list_base<wabt::Expr> *piVar8;
  intrusive_list_base<wabt::Expr> *piVar9;
  pointer *__ptr;
  undefined4 in_register_00000034;
  iterator iVar10;
  undefined4 in_stack_0000000c;
  Expr *in_stack_00000010;
  _Head_base<0UL,_wabt::Expr_*,_false> local_48;
  intrusive_list<wabt::Expr> *local_40;
  Expr *local_38;
  intrusive_list<wabt::Expr> *piVar7;
  
  local_40 = (intrusive_list<wabt::Expr> *)CONCAT44(in_register_00000034,__fdin);
  piVar8 = (intrusive_list_base<wabt::Expr> *)CONCAT44(in_register_0000000c,__fdout);
  p_Var5 = (__off64_t *)CONCAT44(in_stack_0000000c,__flags);
  local_38 = (Expr *)__offin;
  if (p_Var5 == __offout) {
    piVar7 = (intrusive_list<wabt::Expr> *)&__flags;
    do {
      if ((Expr *)__len == in_stack_00000010) {
        return (ssize_t)piVar7;
      }
      if ((Expr *)__len == (Expr *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0xa5,
                      "iterator &wabt::intrusive_list<wabt::Expr>::iterator::operator++() [T = wabt::Expr]"
                     );
      }
      pcVar1 = (((Location *)(piVar8 + 1))->filename).data_;
      if (pcVar1 == (char *)0x0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                      ,0x223,
                      "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                     );
      }
      if ((intrusive_list_base<wabt::Expr> *)__offout != piVar8) break;
      pEVar2 = (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).next_;
      if (piVar8->next_ == piVar8->prev_) {
        piVar8->next_ = (Expr *)0x0;
        piVar8->prev_ = (Expr *)0x0;
      }
      else {
        pEVar3 = (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).prev_;
        piVar9 = &pEVar3->super_intrusive_list_base<wabt::Expr>;
        if (pEVar3 == (Expr *)0x0) {
          piVar9 = piVar8;
        }
        piVar9->next_ = pEVar2;
        pEVar4 = (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).next_;
        if (pEVar4 == (Expr *)0x0) {
          piVar8->prev_ = pEVar3;
        }
        else {
          (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
        }
      }
      (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (((Location *)(piVar8 + 1))->filename).data_ = pcVar1 + -1;
      iVar10.node_ = local_38;
      iVar10.list_ = local_40;
      local_48._M_head_impl = (Expr *)__len;
      iVar10 = insert(this,iVar10,
                      (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_48);
      piVar7 = iVar10.list_;
      if (local_48._M_head_impl != (Expr *)0x0) {
        iVar6 = (*(local_48._M_head_impl)->_vptr_Expr[1])();
        piVar7 = (intrusive_list<wabt::Expr> *)CONCAT44(extraout_var,iVar6);
      }
      local_48._M_head_impl = (Expr *)0x0;
      __len = (size_t)pEVar2;
    } while (p_Var5 == __offout);
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0xc1,
                "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
               );
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}